

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O2

int amqp_messenger_get_send_status
              (AMQP_MESSENGER_HANDLE messenger_handle,AMQP_MESSENGER_SEND_STATUS *send_status)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  AMQP_MESSENGER_INSTANCE_conflict *instance;
  _Bool is_empty;
  
  if (messenger_handle == (AMQP_MESSENGER_HANDLE)0x0 ||
      send_status == (AMQP_MESSENGER_SEND_STATUS *)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x491;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"amqp_messenger_get_send_status",0x490,1,
                "Invalid argument (messenger_handle=%p, send_status=%p)",messenger_handle,
                send_status);
    }
  }
  else {
    iVar1 = message_queue_is_empty(messenger_handle->send_queue,&is_empty);
    if (iVar1 == 0) {
      *send_status = is_empty ^ AMQP_MESSENGER_SEND_STATUS_BUSY;
      iVar1 = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x49b;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                  ,"amqp_messenger_get_send_status",0x49a,1,
                  "Failed verifying if send queue is empty");
      }
    }
  }
  return iVar1;
}

Assistant:

int amqp_messenger_get_send_status(AMQP_MESSENGER_HANDLE messenger_handle, AMQP_MESSENGER_SEND_STATUS* send_status)
{
    int result;

    if (messenger_handle == NULL || send_status == NULL)
    {
        LogError("Invalid argument (messenger_handle=%p, send_status=%p)", messenger_handle, send_status);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_MESSENGER_INSTANCE* instance = (AMQP_MESSENGER_INSTANCE*)messenger_handle;
        bool is_empty;

        if (message_queue_is_empty(instance->send_queue, &is_empty) != 0)
        {
            LogError("Failed verifying if send queue is empty");
            result = MU_FAILURE;
        }
        else
        {
            *send_status = (is_empty ? AMQP_MESSENGER_SEND_STATUS_IDLE : AMQP_MESSENGER_SEND_STATUS_BUSY);
            result = RESULT_OK;
        }
    }

    return result;
}